

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O0

c_int osqp_update_verbose(OSQPWorkspace *work,c_int verbose_new)

{
  char *in_RSI;
  long in_RDI;
  c_int local_8;
  
  if (in_RDI == 0) {
    local_8 = _osqp_error(0,in_RSI);
  }
  else if ((in_RSI == (char *)0x0) || (in_RSI == (char *)0x1)) {
    *(char **)(*(long *)(in_RDI + 0xb8) + 0x88) = in_RSI;
    local_8 = 0;
  }
  else {
    printf("ERROR in %s: ","osqp_update_verbose");
    printf("verbose should be either 0 or 1");
    printf("\n");
    local_8 = 1;
  }
  return local_8;
}

Assistant:

c_int osqp_update_verbose(OSQPWorkspace *work, c_int verbose_new) {

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

  // Check that verbose is either 0 or 1
  if ((verbose_new != 0) && (verbose_new != 1)) {
# ifdef PRINTING
    c_eprint("verbose should be either 0 or 1");
# endif /* ifdef PRINTING */
    return 1;
  }

  // Update verbose
  work->settings->verbose = verbose_new;

  return 0;
}